

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_remove_without_cell(REF_GRID ref_grid,REF_INT node)

{
  int iVar1;
  REF_GEOM ref_geom;
  REF_ADJ pRVar2;
  REF_ADJ pRVar3;
  int iVar4;
  uint uVar5;
  REF_ADJ_ITEM pRVar6;
  long lVar7;
  undefined8 uVar8;
  REF_CELL *ppRVar9;
  ulong uVar10;
  char *pcVar11;
  bool bVar12;
  
  if (-1 < node) {
    ref_geom = ref_grid->geom;
    pRVar2 = ref_geom->ref_adj;
    if ((node < pRVar2->nnode) && (iVar4 = pRVar2->first[(uint)node], iVar4 != -1)) {
LAB_0012d542:
      pRVar6 = pRVar2->item + iVar4;
      iVar4 = pRVar6->ref;
      iVar1 = ref_geom->descr[(long)iVar4 * 6];
      if (iVar1 != 0) {
        if (iVar1 == 1) {
          lVar7 = 0;
LAB_0012d5bb:
          bVar12 = false;
          do {
            if ((-1 < node) && (!bVar12)) {
              pRVar3 = ref_grid->cell[lVar7]->ref_adj;
              if (pRVar3->nnode <= node) goto LAB_0012d5e9;
              bVar12 = pRVar3->first[(uint)node] != -1;
            }
            lVar7 = lVar7 + 1;
            if (lVar7 == 3) {
              if (bVar12) goto LAB_0012d635;
              goto LAB_0012d5f9;
            }
          } while( true );
        }
        if (iVar1 == 2) {
          bVar12 = false;
          lVar7 = 3;
          ppRVar9 = ref_grid->cell + 3;
          do {
            if ((node < 0) || (bVar12)) {
LAB_0012d59d:
              if (lVar7 == 5) goto LAB_0012d607;
            }
            else {
              if (node < (*ppRVar9)->ref_adj->nnode) {
                bVar12 = (*ppRVar9)->ref_adj->first[(uint)node] != -1;
                goto LAB_0012d59d;
              }
              if (lVar7 == 5) goto LAB_0012d60c;
              bVar12 = false;
            }
            ppRVar9 = ref_grid->cell + lVar7 + 1;
            lVar7 = lVar7 + 1;
          } while( true );
        }
        pcVar11 = "can\'t to geom type yet";
        uVar5 = 6;
        uVar8 = 0x27a;
        uVar10 = 6;
        goto LAB_0012d6cc;
      }
      goto LAB_0012d635;
    }
  }
  return 0;
LAB_0012d5e9:
  lVar7 = lVar7 + 1;
  if (lVar7 == 3) goto LAB_0012d5f9;
  goto LAB_0012d5bb;
LAB_0012d5f9:
  uVar5 = ref_geom_remove(ref_geom,iVar4);
  if (uVar5 != 0) {
    uVar8 = 0x268;
LAB_0012d6c9:
    uVar10 = (ulong)uVar5;
    pcVar11 = "remove";
LAB_0012d6cc:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar8,
           "ref_geom_remove_without_cell",uVar10,pcVar11);
    return uVar5;
  }
  goto LAB_0012d61c;
LAB_0012d607:
  if (bVar12) goto LAB_0012d635;
LAB_0012d60c:
  uVar5 = ref_geom_remove(ref_geom,iVar4);
  if (uVar5 != 0) {
    uVar8 = 0x275;
    goto LAB_0012d6c9;
  }
LAB_0012d61c:
  if (node < 0) {
    return 0;
  }
  if (pRVar2->nnode <= node) {
    return 0;
  }
  pRVar6 = (REF_ADJ_ITEM)(pRVar2->first + (uint)node);
LAB_0012d635:
  iVar4 = pRVar6->next;
  if (iVar4 == -1) {
    return 0;
  }
  goto LAB_0012d542;
}

Assistant:

REF_FCN REF_STATUS ref_geom_remove_without_cell(REF_GRID ref_grid,
                                                REF_INT node) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_ADJ ref_adj = ref_geom_adj(ref_geom);
  REF_CELL ref_cell;
  REF_INT type, item, geom, group;
  REF_BOOL supported_by_cell;

  item = ref_adj_first(ref_adj, node);
  while (ref_adj_valid(item)) {
    geom = ref_adj_item_ref(ref_adj, item);
    type = ref_geom_type(ref_geom, geom);
    switch (type) {
      case REF_GEOM_NODE:
        item = ref_adj_item_next(ref_adj, item);
        break;
      case REF_GEOM_EDGE:
        supported_by_cell = REF_FALSE;
        each_ref_grid_edge_ref_cell(ref_grid, group, ref_cell) {
          supported_by_cell =
              (supported_by_cell || !ref_cell_node_empty(ref_cell, node));
        }
        if (supported_by_cell) {
          item = ref_adj_item_next(ref_adj, item);
        } else {
          RSS(ref_geom_remove(ref_geom, geom), "remove");
          item = ref_adj_first(ref_adj, node);
        }
        break;
      case REF_GEOM_FACE:
        supported_by_cell = REF_FALSE;
        each_ref_grid_face_ref_cell(ref_grid, group, ref_cell) {
          supported_by_cell =
              (supported_by_cell || !ref_cell_node_empty(ref_cell, node));
        }
        if (supported_by_cell) {
          item = ref_adj_item_next(ref_adj, item);
        } else {
          RSS(ref_geom_remove(ref_geom, geom), "remove");
          item = ref_adj_first(ref_adj, node);
        }
        break;
      default:
        RSS(REF_IMPLEMENT, "can't to geom type yet");
    }
  }

  return REF_SUCCESS;
}